

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableGrow
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableGrow *curr)

{
  ExternalInterface *pEVar1;
  Name name;
  uint uVar2;
  int iVar3;
  Table *pTVar4;
  Literal *pLVar5;
  uint64_t uVar6;
  Flow *this_00;
  ulong x;
  ulong uVar7;
  undefined1 local_1a0 [8];
  Flow ret;
  Flow fail;
  Flow valueFlow;
  Flow deltaFlow;
  Literal local_68;
  ModuleRunner *local_50;
  undefined1 local_48 [8];
  TableInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&fail.breakTo.super_IString.str._M_str,
             &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->value);
  if (valueFlow.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&valueFlow.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->delta);
    if (deltaFlow.breakTo.super_IString.str._M_len == 0) {
      getTableInstanceInfo((TableInstanceInfo *)local_48,this,(Name)(curr->table).super_IString.str)
      ;
      pEVar1 = ((ModuleRunnerBase<wasm::ModuleRunner> *)local_48)->externalInterface;
      uVar2 = (*pEVar1->_vptr_ExternalInterface[0x1b])
                        (pEVar1,info.instance,info.name.super_IString.str._M_len);
      name.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
      name.super_IString.str._M_len = (size_t)info.instance;
      pTVar4 = Module::getTable(((ModuleRunnerBase<wasm::ModuleRunner> *)local_48)->wasm,name);
      x = (ulong)uVar2;
      Literal::makeFromInt64
                ((Literal *)&deltaFlow.breakTo.super_IString.str._M_str,x,
                 (Type)(pTVar4->addressType).id);
      Flow::Flow((Flow *)local_1a0,(Literal *)&deltaFlow.breakTo.super_IString.str._M_str);
      Literal::~Literal((Literal *)&deltaFlow.breakTo.super_IString.str._M_str);
      Literal::makeFromInt64(&local_68,-1,(Type)(pTVar4->addressType).id);
      this_00 = (Flow *)&ret.breakTo.super_IString.str._M_str;
      Flow::Flow(this_00,&local_68);
      Literal::~Literal(&local_68);
      pLVar5 = Flow::getSingleValue((Flow *)&valueFlow.breakTo.super_IString.str._M_str);
      uVar6 = Literal::getUnsigned(pLVar5);
      uVar7 = x + uVar6;
      if (((!CARRY8(x,uVar6)) && (uVar7 < 0x989681)) && (uVar7 <= (pTVar4->max).addr)) {
        local_50 = info.instance;
        pEVar1 = ((ModuleRunnerBase<wasm::ModuleRunner> *)local_48)->externalInterface;
        pLVar5 = Flow::getSingleValue((Flow *)&fail.breakTo.super_IString.str._M_str);
        iVar3 = (*pEVar1->_vptr_ExternalInterface[7])
                          (pEVar1,local_50,info.name.super_IString.str._M_len,pLVar5,(ulong)uVar2,
                           uVar7 & 0xffffffff);
        this_00 = (Flow *)&ret.breakTo.super_IString.str._M_str;
        if ((char)iVar3 != '\0') {
          this_00 = (Flow *)local_1a0;
        }
      }
      Flow::Flow(__return_storage_ptr__,this_00);
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&ret.breakTo.super_IString.str._M_str);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_1a0);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&valueFlow.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&valueFlow.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)&fail.breakTo.super_IString.str._M_str);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&fail.breakTo.super_IString.str._M_str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableGrow(TableGrow* curr) {
    NOTE_ENTER("TableGrow");
    Flow valueFlow = self()->visit(curr->value);
    if (valueFlow.breaking()) {
      return valueFlow;
    }
    Flow deltaFlow = self()->visit(curr->delta);
    if (deltaFlow.breaking()) {
      return deltaFlow;
    }
    auto info = getTableInstanceInfo(curr->table);

    uint64_t tableSize = info.interface()->tableSize(info.name);
    auto* table = info.instance->wasm.getTable(info.name);
    Flow ret = Literal::makeFromInt64(tableSize, table->addressType);
    Flow fail = Literal::makeFromInt64(-1, table->addressType);
    uint64_t delta = deltaFlow.getSingleValue().getUnsigned();

    uint64_t newSize;
    if (std::ckd_add(&newSize, tableSize, delta)) {
      return fail;
    }
    if (newSize > table->max || newSize > WebLimitations::MaxTableSize) {
      return fail;
    }
    if (!info.interface()->growTable(
          info.name, valueFlow.getSingleValue(), tableSize, newSize)) {
      // We failed to grow the table in practice, even though it was valid
      // to try to do so.
      return fail;
    }
    return ret;
  }